

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

void __thiscall wasm::I64ToI32Lowering::doWalkModule(I64ToI32Lowering *this,Module *module)

{
  bool bVar1;
  __uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_> _Var2;
  char *pcVar3;
  undefined8 uVar4;
  long *plVar5;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> uVar6;
  undefined8 *puVar7;
  Const *pCVar8;
  Global *curr;
  long lVar9;
  __hashtable *p_Var10;
  char *extraout_RDX;
  __hashtable *p_Var11;
  Name n;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar12;
  Name NVar13;
  string_view sVar14;
  anon_union_16_6_1532cd5a_for_Literal_0 local_1e8;
  undefined8 local_1d8;
  size_t local_60;
  element_type *local_58;
  __hashtable *__h;
  Module *local_48;
  _Head_base<0UL,_wasm::Global_*,_false> local_40;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> high;
  
  high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)
       (__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>)this;
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    puVar7 = (undefined8 *)operator_new(8);
    *puVar7 = module;
    *(undefined8 **)
     ((long)high._M_t.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x130) = puVar7;
  }
  lVar9 = (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(module->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    local_58 = (element_type *)
               ((long)high._M_t.
                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x218);
    p_Var10 = (__hashtable *)(lVar9 + (ulong)(lVar9 == 0));
    p_Var11 = (__hashtable *)0x0;
    __h = p_Var10;
    local_48 = module;
    do {
      _Var2._M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
      super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
           (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)p_Var11]._M_t.
           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t;
      if (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) == 3) {
        local_1e8.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_58;
        pVar12 = std::
                 _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                           ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_58,
                            _Var2._M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,&local_1e8);
        NVar13.super_IString.str._M_str = pVar12._8_8_;
        *(undefined8 *)
         ((long)_Var2._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x38) = 2;
        NVar13.super_IString.str._M_len =
             *(size_t *)
              ((long)_Var2._M_t.
                     super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                     super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 8);
        NVar13 = makeHighName(*(wasm **)_Var2._M_t.
                                        super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                        .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl,
                              NVar13);
        local_60 = NVar13.super_IString.str._M_len;
        pCVar8 = Builder::makeConst<int>
                           (*(Builder **)
                             ((long)high._M_t.
                                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                    .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl +
                             0x130),0);
        bVar1 = *(bool *)((long)_Var2._M_t.
                                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x48);
        local_40._M_head_impl = (Global *)operator_new(0x50);
        ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len = 0;
        ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
             (char *)0x0;
        *(undefined8 *)&((local_40._M_head_impl)->super_Importable).super_Named.hasExplicitName = 0;
        ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_len = 0;
        ((local_40._M_head_impl)->super_Importable).module.super_IString.str._M_str = (char *)0x0;
        ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_len = 0;
        ((local_40._M_head_impl)->super_Importable).base.super_IString.str._M_str = (char *)0x0;
        ((local_40._M_head_impl)->type).id = 0;
        (local_40._M_head_impl)->init = (Expression *)0x0;
        *(undefined8 *)&(local_40._M_head_impl)->mutable_ = 0;
        ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
             local_60;
        ((local_40._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
             NVar13.super_IString.str._M_str;
        ((local_40._M_head_impl)->type).id = 2;
        (local_40._M_head_impl)->init = (Expression *)pCVar8;
        (local_40._M_head_impl)->mutable_ = bVar1;
        if (*(long *)((long)_Var2._M_t.
                            super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                            .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x20) != 0)
        {
          Fatal::Fatal((Fatal *)&local_1e8.func);
          Fatal::operator<<((Fatal *)&local_1e8.func,(char (*) [27])"TODO: imported i64 globals");
          Fatal::~Fatal((Fatal *)&local_1e8.func);
        }
        pcVar3 = *(char **)((long)_Var2._M_t.
                                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                  .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40)
        ;
        if (*pcVar3 == '\n') {
          plVar5 = *(long **)((long)high._M_t.
                                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                    .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl +
                             0x130);
          n.super_IString.str._M_str = extraout_RDX;
          n.super_IString.str._M_len = *(size_t *)(pcVar3 + 0x18);
          sVar14 = (string_view)makeHighName(*(wasm **)(pcVar3 + 0x10),n);
          pCVar8 = (Const *)MixedArena::allocSpace((MixedArena *)(*plVar5 + 0x200),0x20,8);
          (pCVar8->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id =
               GlobalGetId;
          (pCVar8->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
          (pCVar8->value).field_0.i64 = 0;
          (pCVar8->value).field_0.func.super_IString.str = sVar14;
          (pCVar8->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 2;
        }
        else {
          if (*pcVar3 != '\x0e') {
            handle_unreachable("unexpected expression type",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                               ,0x8a);
          }
          if (*(long *)(pcVar3 + 0x20) != 3) {
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x129,"int64_t wasm::Literal::geti64() const");
          }
          uVar4 = *(undefined8 *)(pcVar3 + 0x10);
          local_1e8.i32 = (int)uVar4;
          local_1d8 = 2;
          Literal::operator=((Literal *)(pcVar3 + 0x10),(Literal *)&local_1e8.func);
          Literal::~Literal((Literal *)&local_1e8.func);
          pcVar3[8] = '\x02';
          pcVar3[9] = '\0';
          pcVar3[10] = '\0';
          pcVar3[0xb] = '\0';
          pcVar3[0xc] = '\0';
          pcVar3[0xd] = '\0';
          pcVar3[0xe] = '\0';
          pcVar3[0xf] = '\0';
          pCVar8 = Builder::makeConst<unsigned_int>
                             (*(Builder **)
                               ((long)high._M_t.
                                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                      .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl +
                               0x130),(uint)((ulong)uVar4 >> 0x20));
        }
        module = local_48;
        (local_40._M_head_impl)->init = (Expression *)pCVar8;
        *(undefined8 *)
         (*(long *)((long)_Var2._M_t.
                          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                          .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x40) + 8) =
             2;
        Module::addGlobal(local_48,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                                   &local_40);
        p_Var10 = __h;
        if (local_40._M_head_impl != (Global *)0x0) {
          operator_delete(local_40._M_head_impl,0x50);
          p_Var10 = __h;
        }
      }
      p_Var11 = (__hashtable *)((long)&p_Var11->_M_buckets + 1);
    } while (p_Var10 != p_Var11);
  }
  curr = (Global *)operator_new(0x50);
  uVar6 = high;
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->type).id = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  curr->init = (Expression *)0x0;
  *(undefined8 *)&curr->mutable_ = 0;
  (curr->type).id = 2;
  pcVar3 = DAT_010d12c8;
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = INT64_TO_32_HIGH_BITS;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = pcVar3;
  pCVar8 = Builder::makeConst<int>
                     (*(Builder **)
                       ((long)high._M_t.
                              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                              .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x130),0)
  ;
  curr->init = (Expression *)pCVar8;
  curr->mutable_ = true;
  Module::addGlobal(module,curr);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::doWalkModule
            ((Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_> *)
             ((long)uVar6._M_t.
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x58),module);
  return;
}

Assistant:

void doWalkModule(Module* module) {
    if (!builder) {
      builder = std::make_unique<Builder>(*module);
    }
    // add new globals for high bits
    for (size_t i = 0, globals = module->globals.size(); i < globals; ++i) {
      auto* curr = module->globals[i].get();
      if (curr->type != Type::i64) {
        continue;
      }
      originallyI64Globals.insert(curr->name);
      curr->type = Type::i32;
      auto high = builder->makeGlobal(makeHighName(curr->name),
                                      Type::i32,
                                      builder->makeConst(int32_t(0)),
                                      curr->mutable_ ? Builder::Mutable
                                                     : Builder::Immutable);
      if (curr->imported()) {
        Fatal() << "TODO: imported i64 globals";
      } else {
        if (auto* c = curr->init->dynCast<Const>()) {
          uint64_t value = c->value.geti64();
          c->value = Literal(uint32_t(value));
          c->type = Type::i32;
          high->init = builder->makeConst(uint32_t(value >> 32));
        } else if (auto* get = curr->init->dynCast<GlobalGet>()) {
          high->init =
            builder->makeGlobalGet(makeHighName(get->name), Type::i32);
        } else {
          WASM_UNREACHABLE("unexpected expression type");
        }
        curr->init->type = Type::i32;
      }
      module->addGlobal(std::move(high));
    }

    // For functions that return 64-bit values, we use this global variable
    // to return the high 32 bits.
    auto* highBits = new Global();
    highBits->type = Type::i32;
    highBits->name = INT64_TO_32_HIGH_BITS;
    highBits->init = builder->makeConst(int32_t(0));
    highBits->mutable_ = true;
    module->addGlobal(highBits);
    PostWalker<I64ToI32Lowering>::doWalkModule(module);
  }